

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
::clear(Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
        *this,ID_index rowIndex)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  iterator it;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *entry;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *pSStack_10;
  ID_index rowIndex_local;
  Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
  *this_local;
  
  entry._4_4_ = rowIndex;
  pSStack_10 = this;
  it._M_node = (_Base_ptr)
               New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>>
               ::construct<unsigned_int&>
                         ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,false,false,false>>>>
                           *)this->entryPool_,(uint *)((long)&entry + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
       ::find(&this->column_,(key_type *)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_*>_>
       ::end(&this->column_);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    _delete_entry(this,&local_28);
  }
  New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>_>
  ::destroy(this->entryPool_,
            (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_false,_false,_false>_>_>
             *)it._M_node);
  return;
}

Assistant:

inline void Set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}